

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h265e_enctropy.c
# Opt level: O2

void h265e_reset_enctropy(void *slice_ctx)

{
  RK_U8 cabacIntFlag;
  SliceType sliceType;
  RK_S32 qp;
  
  cabacIntFlag = *(RK_U8 *)((long)slice_ctx + 0x6c8);
  sliceType = *(SliceType *)((long)slice_ctx + 0x41c);
  qp = *(RK_S32 *)((long)slice_ctx + 0x428);
  if (((byte)h265e_debug & 1) != 0) {
    _mpp_log_l(4,"h265e_cabac","enter\n","h265e_reset_enctropy");
  }
  initBuffer((H265eContextModel_t *)((long)slice_ctx + 0x3d8),sliceType,cabacIntFlag,qp,
             INIT_SPLIT_FLAG[0],3);
  initBuffer((H265eContextModel_t *)((long)slice_ctx + 0x3de),sliceType,cabacIntFlag,qp,
             INIT_SKIP_FLAG[0],3);
  initBuffer((H265eContextModel_t *)((long)slice_ctx + 0x3e4),sliceType,cabacIntFlag,qp,
             INIT_MERGE_FLAG_EXT[0],1);
  initBuffer((H265eContextModel_t *)((long)slice_ctx + 0x3e6),sliceType,cabacIntFlag,qp,
             INIT_MERGE_IDX_EXT[0],1);
  if (((byte)h265e_debug & 1) == 0) {
    return;
  }
  _mpp_log_l(4,"h265e_cabac","leave\n","h265e_reset_enctropy");
  return;
}

Assistant:

void h265e_reset_enctropy(void *slice_ctx)
{
    H265eSlice *slice = (H265eSlice *)slice_ctx;
    RK_U8 cabacInitFlag = slice->m_cabacInitFlag;
    RK_S32  qp              = slice->m_sliceQp;
    SliceType sliceType  = slice->m_sliceType;

    h265e_dbg_func("enter\n");
    initBuffer(&slice->m_contextModels[OFF_SPLIT_FLAG_CTX], sliceType, cabacInitFlag, qp, (RK_U8*)INIT_SPLIT_FLAG, NUM_SPLIT_FLAG_CTX);
    initBuffer(&slice->m_contextModels[OFF_SKIP_FLAG_CTX], sliceType, cabacInitFlag, qp, (RK_U8*)INIT_SKIP_FLAG, NUM_SKIP_FLAG_CTX);
    initBuffer(&slice->m_contextModels[OFF_MERGE_FLAG_EXT_CTX], sliceType, cabacInitFlag, qp, (RK_U8*)INIT_MERGE_FLAG_EXT, NUM_MERGE_FLAG_EXT_CTX);
    initBuffer(&slice->m_contextModels[OFF_MERGE_IDX_EXT_CTX], sliceType, cabacInitFlag, qp, (uint8_t*)INIT_MERGE_IDX_EXT, NUM_MERGE_IDX_EXT_CTX);

    h265e_dbg_func("leave\n");
}